

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O0

QDate __thiscall QDate::addMonths(QDate *this,int nmonths)

{
  bool bVar1;
  int iVar2;
  int in_ESI;
  qint64 *in_RDI;
  long in_FS_OFFSET;
  YearMonthDay YVar3;
  YearMonthDay parts;
  QDate *in_stack_ffffffffffffff90;
  undefined4 uVar4;
  undefined4 in_stack_ffffffffffffffb0;
  int local_30;
  int iStack_2c;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined8 local_20;
  int local_18;
  qint64 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = (undefined4)((ulong)in_RDI >> 0x20);
  bVar1 = isNull((QDate *)0x5696ce);
  if (bVar1) {
    QDate(in_stack_ffffffffffffff90);
  }
  else if (in_ESI == 0) {
    local_10 = *in_RDI;
  }
  else {
    local_20 = &DAT_aaaaaaaaaaaaaaaa;
    local_18 = -0x55555556;
    YVar3 = QGregorianCalendar::partsFromJulian
                      (CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    _local_30 = YVar3._0_8_;
    local_18 = YVar3.day;
    local_20._0_4_ = local_30;
    local_20._4_4_ = iStack_2c;
    bVar1 = QCalendar::YearMonthDay::isValid((YearMonthDay *)&local_20);
    if (bVar1) {
      local_20._4_4_ = in_ESI + local_20._4_4_;
      while (local_20._4_4_ < 1) {
        if ((int)local_20 + -1 != 0) {
          local_20._4_4_ = local_20._4_4_ + 0xc;
        }
        local_20._0_4_ = (int)local_20 + -1;
      }
      while( true ) {
        if (local_20._4_4_ < 0xd) break;
        iVar2 = (int)local_20 + 1;
        if (iVar2 == 0) {
          iVar2 = (int)local_20 + 2;
        }
        local_20._4_4_ = local_20._4_4_ + -0xc;
        local_20._0_4_ = iVar2;
      }
      YVar3.month = in_stack_ffffffffffffffb0;
      YVar3.year = uVar4;
      YVar3.day = (int)local_20;
      local_10 = (qint64)fixedDate(YVar3);
    }
    else {
      QDate(in_stack_ffffffffffffff90);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QDate)local_10;
}

Assistant:

QDate QDate::addMonths(int nmonths) const
{
    if (isNull())
        return QDate();

    if (nmonths == 0)
        return *this;

    auto parts = QGregorianCalendar::partsFromJulian(jd);

    if (!parts.isValid())
        return QDate();
    Q_ASSERT(parts.year);

    parts.month += nmonths;
    while (parts.month <= 0) {
        if (--parts.year) // skip over year 0
            parts.month += 12;
    }
    while (parts.month > 12) {
        parts.month -= 12;
        if (!++parts.year) // skip over year 0
            ++parts.year;
    }

    return fixedDate(parts);
}